

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord2h *value)

{
  bool bVar1;
  half hVar2;
  _Type in_RAX;
  float2 v;
  array<float,_2UL> local_18;
  
  local_18._M_elems = in_RAX;
  bVar1 = ParseBasicTypeTuple<float,2ul>(this,&local_18);
  if (bVar1) {
    hVar2 = tinyusdz::value::float_to_half_full(local_18._M_elems[0]);
    (value->s).value = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_18._M_elems[1]);
    (value->t).value = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord2h *value) {
  // parse as float2
  value::float2 v;
  if (ParseBasicTypeTuple(&v)) {
    value->s = value::float_to_half_full(v[0]);
    value->t = value::float_to_half_full(v[1]);
    return true;
  }
  return false;
}